

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_METAL_TEXM3X2TEX(Context *ctx)

{
  size_t len;
  char *pcVar1;
  char *pcVar2;
  char sampler [64];
  char src1 [64];
  char src0 [64];
  char src2 [64];
  char dst [64];
  char code [512];
  
  if (ctx->texm3x2pad_src0 != -1) {
    ctx->metal_need_header_texture = 1;
    ctx->metal_need_header_geometric = 1;
    snprintf(code,0x10,"%u",(ulong)(uint)(ctx->dest_arg).regnum);
    snprintf(sampler,0x40,"%s%s","s",code);
    pcVar1 = "t";
    pcVar2 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar2 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x2pad_src0);
    snprintf(src0,0x40,"%s%s",pcVar2,code);
    pcVar2 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar2 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x2pad_dst0);
    snprintf(src1,0x40,"%s%s",pcVar2,code);
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar1 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->source_args[0].regnum);
    snprintf(src2,0x40,"%s%s",pcVar1,code);
    get_METAL_destarg_varname(ctx,dst,len);
    make_METAL_destarg_assign
              (ctx,code,0x200,
               "%s_texture.sample(%s, float2(dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz)))",sampler,
               sampler,src0,src1,src2,dst);
    output_line(ctx,"%s",code);
  }
  return;
}

Assistant:

static void emit_METAL_TEXM3X2TEX(Context *ctx)
{
    if (ctx->texm3x2pad_src0 == -1)
        return;

    DestArgInfo *info = &ctx->dest_arg;
    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char sampler[64];
    char code[512];

    ctx->metal_need_header_texture = 1;
    ctx->metal_need_header_geometric = 1;

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                            sampler, sizeof (sampler));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_src0,
                            src0, sizeof (src0));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_dst0,
                            src1, sizeof (src1));
    get_METAL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src2, sizeof (src2));
    get_METAL_destarg_varname(ctx, dst, sizeof (dst));

    make_METAL_destarg_assign(ctx, code, sizeof (code),
        "%s_texture.sample(%s, float2(dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz)))",
        sampler, sampler, src0, src1, src2, dst);

    output_line(ctx, "%s", code);
}